

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

void choose_artifact_theme(artifact *art)

{
  int16_t iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  wchar_t wVar4;
  object_kind *poVar5;
  activation *paVar6;
  long lVar7;
  wchar_t wVar8;
  char *pcVar9;
  char *pcVar10;
  _Bool _Var11;
  int iVar12;
  
  poVar5 = lookup_kind(art->tval,art->sval);
  wVar8 = potential;
  if ((L'ᝰ' < potential) && (uVar2 = Rand_div(30000), uVar2 + L'\x01' < wVar8)) {
    iVar12 = -3;
    do {
      uVar2 = Rand_div(z_info->curse_max - 1);
      uVar3 = Rand_div(9);
      iVar1 = m_bonus(9,art->alloc_min);
      if (curses[uVar2 + L'\x01'].poss[art->tval] == true) {
        append_artifact_curse(art,uVar2 + L'\x01',uVar3 + iVar1 * 10 + L'\x01');
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != 0);
  }
  switch(poVar5->tval) {
  case L'\x05':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(9);
    art->to_d = ((short)((ulong)((long)potential * 0x64d319ff) >> 0x28) -
                (short)((long)potential * 0x64d319ff >> 0x3f)) + (short)uVar3 + art->to_d + 4;
    uVar3 = Rand_div(9);
    wVar8 = potential;
    art->to_h = ((short)((ulong)((long)potential * 0x64d319ff) >> 0x28) -
                (short)((long)potential * 0x64d319ff >> 0x3f)) + (short)uVar3 + art->to_h + 4;
    if ((int)uVar2 < 0x32) {
      get_property(art,(object *)0x0,"shooting speed",L'\x01',true);
      if ((L'ߏ' < potential) && (uVar2 = Rand_div(3), uVar2 == 0)) {
        pcVar9 = "shooting power";
LAB_00191561:
        get_property(art,(object *)0x0,pcVar9,L'\x01',false);
      }
    }
    else {
      if (wVar8 < L'ྠ') {
LAB_00191522:
        wVar8 = L'\x01';
      }
      else {
        wVar8 = L'\x02';
        uVar2 = Rand_div(2);
        if (uVar2 != 0) goto LAB_00191522;
      }
      get_property(art,(object *)0x0,"shooting power",wVar8,true);
      if ((L'ࣉ' < potential) && (uVar2 = Rand_div(3), uVar2 == 0)) {
        pcVar9 = "shooting speed";
        goto LAB_00191561;
      }
    }
    wVar8 = potential;
    uVar2 = Rand_div(5000);
    if ((uVar2 + L'\x01' < wVar8) && (uVar2 = Rand_div(3), uVar2 != 0)) {
      uVar2 = Rand_div(2);
      pcVar9 = "RAND_BRAND_MISSILE";
      if (uVar2 == 0) {
        pcVar9 = "RAND_SUPER_SHOOTING";
      }
      paVar6 = lookup_activation(pcVar9);
      art->activation = paVar6;
    }
    if (potential < L'Ϩ') {
      potential = L'Ϩ';
    }
    break;
  default:
    msg("error -- object kind not recognized.");
    break;
  case L'\a':
  case L'\b':
  case L'\t':
    choose_melee_weapon_theme(art);
    break;
  case L'\n':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(5);
    wVar8 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 7;
    if ((int)uVar2 < 0x19) {
      if (L'ᆓ' < wVar8) {
        iVar12 = damroll(3,2);
        wVar8 = iVar12 + L'\x05';
        pcVar9 = "speed";
        _Var11 = true;
LAB_00192637:
        get_property(art,(object *)0x0,pcVar9,wVar8,_Var11);
      }
    }
    else if ((int)uVar2 < 0x23) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar2 * 5 + L'#',true);
      get_property(art,(object *)0x0,"feather falling",L'\0',true);
      uVar2 = Rand_div(5);
      if (uVar2 == 0) {
        wVar8 = lookup_curse("anti-teleportation");
        uVar2 = Rand_div(0x14);
        append_artifact_curse(art,wVar8,uVar2 + L'(');
        potential = potential + L'Ĭ';
      }
    }
    else {
      if (0x31 < (int)uVar2) {
        if ((int)uVar2 < 0x3c) {
          uVar2 = Rand_div(2);
          if (uVar2 == 0) {
            pcVar9 = "RAND_HEAL1";
            if (L'ஷ' < potential) {
              pcVar9 = "RAND_HEAL2";
            }
            pcVar10 = "RAND_HEAL3";
            if (potential < L'ᕼ') {
              pcVar10 = pcVar9;
            }
            paVar6 = lookup_activation(pcVar10);
            art->activation = paVar6;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"extra moves",(uint)(uVar2 == 0) + L'\x01',true);
          uVar2 = Rand_div(4);
          wVar8 = uVar2 + L'\x01';
          pcVar9 = "constitution";
        }
        else if ((int)uVar2 < 0x46) {
          uVar2 = Rand_div(3);
          if ((uVar2 != 0) && (L'ৃ' < potential)) {
            paVar6 = lookup_activation("RAND_STORM_DANCE");
            art->activation = paVar6;
          }
          get_property(art,(object *)0x0,"feather falling",L'\0',true);
          uVar2 = Rand_div(4);
          wVar8 = uVar2 + L'\x01';
          pcVar9 = "dexterity";
        }
        else {
          if (0x4f < (int)uVar2) goto LAB_0019263c;
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            paVar6 = lookup_activation("RAND_DETECT_MONSTERS");
            art->activation = paVar6;
          }
          get_property(art,(object *)0x0,"regeneration",L'\0',true);
          get_property(art,(object *)0x0,"slow digestion",L'\0',true);
          uVar2 = Rand_div(6);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"telepathy",L'\0',false);
          }
          uVar2 = Rand_div(4);
          wVar8 = uVar2 + L'\x01';
          pcVar9 = "stealth";
        }
        _Var11 = false;
        goto LAB_00192637;
      }
      pcVar9 = "RAND_TELEPORT1";
      if (L'ߏ' < wVar8) {
        pcVar9 = "RAND_TELEPORT2";
      }
      pcVar10 = "RAND_RECALL";
      if (wVar8 < L'ྠ') {
        pcVar10 = pcVar9;
      }
      paVar6 = lookup_activation(pcVar10);
      art->activation = paVar6;
      potential = (potential * 2) / 3;
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"nexus resistance",uVar2 * 5 + L'#',true);
      get_property(art,(object *)0x0,"trap immunity",L'\0',true);
      if (L'ϧ' < potential) {
        uVar2 = Rand_div(4);
        get_property(art,(object *)0x0,"dexterity",uVar2 + L'\x01',false);
      }
      uVar2 = Rand_div(5);
      if (uVar2 == 0) {
        wVar8 = lookup_curse("teleportation");
        uVar2 = Rand_div(0x14);
        append_artifact_curse(art,wVar8,uVar2 + L'(');
        potential = potential + L'd';
      }
    }
LAB_0019263c:
    uVar2 = Rand_div(4);
    if (((uVar2 != 0) || (art->activation != (activation *)0x0)) || (potential < L'ߐ')) break;
    pcVar9 = "RAND_SPEED";
LAB_00192673:
    paVar6 = lookup_activation(pcVar9);
    art->activation = paVar6;
    break;
  case L'\v':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(5);
    wVar8 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 8;
    if (0x1d < (int)uVar2) {
      if (0x2c < (int)uVar2) {
        if ((int)uVar2 < 0x3c) {
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"armor bonus",uVar2 + L'\x05',false);
          iVar12 = 1;
          do {
            uVar2 = Rand_div(4);
            if (uVar2 == 0) {
              uVar3 = Rand_div(5);
              get_property(art,(object *)0x0,"fire resistance",uVar3 * 5 + L'#',true);
            }
            if (uVar2 == 1) {
              uVar3 = Rand_div(5);
              get_property(art,(object *)0x0,"cold resistance",uVar3 * 5 + L'#',true);
            }
            if (uVar2 == 2) {
              uVar3 = Rand_div(5);
              get_property(art,(object *)0x0,"acid resistance",uVar3 * 5 + L'#',true);
            }
            if (uVar2 == 3) {
              uVar3 = Rand_div(5);
              get_property(art,(object *)0x0,"electricity resistance",uVar3 * 5 + L'#',true);
            }
            if ((L'ǳ' < potential) && (uVar3 = Rand_div(3), uVar3 != 0)) {
              if (uVar2 == 0) {
                paVar6 = lookup_activation("RAND_FIRE1");
                art->activation = paVar6;
              }
              if (uVar2 == 1) {
                paVar6 = lookup_activation("RAND_COLD1");
                art->activation = paVar6;
              }
              if (uVar2 == 2) {
                paVar6 = lookup_activation("RAND_ACID1");
                art->activation = paVar6;
              }
              if (uVar2 == 3) {
                paVar6 = lookup_activation("RAND_ELEC1");
                art->activation = paVar6;
              }
            }
            iVar12 = iVar12 + -1;
          } while (iVar12 == 0);
          break;
        }
        if ((int)uVar2 < 0x4b) {
          paVar6 = lookup_activation("RAND_DISARM");
          art->activation = paVar6;
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"stealth",uVar2 + L'\x01',false);
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"searching skill",uVar2 + L'\x01',false);
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            get_property(art,(object *)0x0,"free action",L'\0',false);
          }
          uVar2 = Rand_div(5);
          if (uVar2 != 0) break;
          uVar2 = Rand_div(6);
          wVar8 = uVar2 * -5 + L'\xfffffffb';
          goto LAB_001910c9;
        }
        if ((int)uVar2 < 0x5a) {
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"magic mastery",uVar2 + L'\x01',false);
          pcVar9 = "trap immunity";
        }
        else {
          if (L'ණ' < wVar8 || 99 < (int)uVar2) break;
          paVar6 = lookup_activation("RAND_SUPER_SHOOTING");
          art->activation = paVar6;
          potential = potential + L'\xfffffd12';
          uVar2 = Rand_div(5);
          get_property(art,(object *)0x0,"deadliness bonus",uVar2 + L'\x06',false);
          get_property(art,(object *)0x0,"skill bonus",uVar2 + L'\x06',false);
          uVar2 = Rand_div(3);
          if (uVar2 == 0) break;
          pcVar9 = "free action";
        }
        goto LAB_00190d63;
      }
      get_property(art,(object *)0x0,"protection from fear",L'\0',true);
      uVar2 = Rand_div(3);
      if (uVar2 != 0) {
        get_property(art,(object *)0x0,"regeneration",L'\0',false);
      }
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        get_property(art,(object *)0x0,"free action",L'\0',false);
      }
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        uVar2 = Rand_div(4);
        pcVar9 = "strength";
      }
      else {
        uVar3 = Rand_div(2);
        uVar2 = Rand_div(4);
        if (uVar3 == 0) {
          pcVar9 = "dexterity";
        }
        else {
          pcVar9 = "constitution";
        }
      }
      get_property(art,(object *)0x0,pcVar9,uVar2 + L'\x01',false);
      if ((L'כ' < potential) && (uVar2 = Rand_div(4), uVar2 != 0)) {
        uVar2 = Rand_div(4);
        get_property(art,(object *)0x0,"deadliness bonus",uVar2 + L'\x05',false);
        get_property(art,(object *)0x0,"skill bonus",uVar2 + L'\x05',false);
      }
      uVar2 = Rand_div(6);
      if (uVar2 != 0) break;
      uVar2 = Rand_div(6);
      wVar8 = uVar2 * -5 + L'\xfffffffb';
LAB_00190cf8:
      pcVar9 = "poison resistance";
      goto LAB_00191706;
    }
    uVar2 = Rand_div(4);
    get_property(art,(object *)0x0,"skill bonus",uVar2 + L'\a',true);
    get_property(art,(object *)0x0,"deadliness bonus",uVar2 + L'\a',true);
    uVar2 = Rand_div(3);
    if (uVar2 != 0) {
      get_property(art,(object *)0x0,"free action",L'\0',true);
    }
    uVar2 = Rand_div(6);
    if (uVar2 != 0) break;
    uVar2 = Rand_div(3);
    wVar8 = ~uVar2;
    pcVar9 = "stealth";
    goto LAB_001913c5;
  case L'\f':
  case L'\r':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(6);
    wVar8 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 9;
    if ((int)uVar2 < 0x18) {
      if (L'ණ' < wVar8) break;
      pcVar9 = "telepathy";
LAB_00190d63:
      wVar8 = L'\0';
    }
    else if ((int)uVar2 < 0x23) {
      uVar2 = Rand_div(2);
      if ((uVar2 == 0) && (L'ᆓ' < potential)) {
        paVar6 = lookup_activation("RAND_CURE");
        art->activation = paVar6;
      }
      get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
      uVar2 = Rand_div(5);
      wVar8 = uVar2 * 5 + L'#';
LAB_001910c9:
      pcVar9 = "sound resistance";
    }
    else if ((int)uVar2 < 0x2e) {
      uVar2 = Rand_div(3);
      if (uVar2 != 0) {
        pcVar9 = "RAND_DETECT_D_S_T";
        if (L'ລ' < potential) {
          pcVar9 = "RAND_DETECT_ALL";
        }
        paVar6 = lookup_activation(pcVar9);
        art->activation = paVar6;
      }
      get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
      get_property(art,(object *)0x0,"see invisible",L'\0',false);
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        get_property(art,(object *)0x0,"darkness",L'\0',false);
      }
      uVar2 = Rand_div(4);
      wVar8 = uVar2 + L'\x01';
      pcVar9 = "searching skill";
    }
    else {
      if (0x38 < (int)uVar2) {
        if ((int)uVar2 < 0x44) {
          if ((wVar8 < L'ৄ') || (uVar2 = Rand_div(3), uVar2 == 0)) {
            pcVar9 = "RAND_HEROISM";
          }
          else {
            pcVar9 = "RAND_FRIGHTEN_ALL";
          }
          paVar6 = lookup_activation(pcVar9);
          art->activation = paVar6;
          get_property(art,(object *)0x0,"protection from fear",L'\0',false);
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"strength",uVar2 + L'\x01',false);
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"dexterity",uVar2 + L'\x01',false);
          get_property(art,(object *)0x0,"sustain dexterity",L'\0',true);
          pcVar9 = "sustain strength";
          wVar8 = L'\0';
          goto LAB_001913c5;
        }
        if (0x4e < (int)uVar2) {
          if ((0x59 < (int)uVar2) || (uVar2 = Rand_div(3), uVar2 == 0)) break;
          pcVar9 = "RAND_HEAL1";
          if (L'ৃ' < potential) {
            pcVar9 = "RAND_HEAL2";
          }
          pcVar10 = "RAND_HEAL3";
          if (potential < L'ྠ') {
            pcVar10 = pcVar9;
          }
          paVar6 = lookup_activation(pcVar10);
          art->activation = paVar6;
          pcVar9 = "regeneration";
          goto LAB_00190d63;
        }
        if (L'ৃ' < wVar8) break;
        pcVar9 = "RAND_IDENTIFY";
        goto LAB_00192673;
      }
      uVar2 = Rand_div(4);
      get_property(art,(object *)0x0,"wisdom",uVar2 + L'\x01',false);
      uVar2 = Rand_div(3);
      if (uVar2 != 0) break;
      uVar2 = Rand_div(2);
      wVar8 = uVar2 + L'\x03';
      pcVar9 = "extra armor";
    }
LAB_00191706:
    _Var11 = false;
    goto LAB_00191709;
  case L'\x0e':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(8);
    wVar8 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 9;
    if (0x11 < (int)uVar2) {
      if ((int)uVar2 < 0x1e) {
        uVar2 = Rand_div(4);
        get_property(art,(object *)0x0,"constitution",uVar2 + L'\x01',false);
        uVar2 = Rand_div(4);
        wVar8 = uVar2 + L'\x01';
        pcVar9 = "strength";
        goto LAB_00191706;
      }
      if ((int)uVar2 < 0x2d) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"shards resistance",uVar2 * 5 + L'#',true);
        uVar2 = Rand_div(3);
        wVar8 = potential / 0x4b0 + uVar2 + L'\x01';
        pcVar9 = "extra armor";
      }
      else if ((int)uVar2 < 0x37) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"light resistance",uVar2 * 5 + L'#',true);
        uVar2 = Rand_div(5);
        wVar8 = uVar2 * 5 + L'#';
        pcVar9 = "dark resistance";
      }
      else {
        if ((int)uVar2 < 0x55) {
          uVar2 = Rand_div(3);
          if ((uVar2 == 0) && (L'ྟ' < potential)) {
            paVar6 = lookup_activation("RAND_SHIELD");
            art->activation = paVar6;
          }
          uVar2 = Rand_div(6);
          get_property(art,(object *)0x0,"armor bonus",potential / 2000 + uVar2 + L'\x01',true);
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"regeneration",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"feather falling",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"hold life",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"see invisible",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"free action",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"protection from blindness",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 == 0) {
            get_property(art,(object *)0x0,"protection from confusion",L'\0',false);
          }
          uVar2 = Rand_div(4);
          if (uVar2 != 0) break;
          pcVar9 = "protection from stunning";
          goto LAB_00190d63;
        }
        if (wVar8 < L'ᎈ' || 99 < (int)uVar2) break;
        uVar2 = Rand_div(4);
        switch(uVar2) {
        case 0:
          pcVar9 = "fire resistance";
          break;
        case 1:
          pcVar9 = "cold resistance";
          break;
        case 2:
          pcVar9 = "acid resistance";
          break;
        case 3:
          pcVar9 = "electricity resistance";
          break;
        default:
          goto switchD_0019286c_default;
        }
        wVar8 = L'd';
      }
      goto LAB_001913c5;
    }
    uVar2 = Rand_div(3);
    if (L'ஷ' < potential && uVar2 == 0) {
      pcVar9 = "RAND_RESIST_ELEMENTS";
      if (L'ᕻ' < potential) {
        pcVar9 = "RAND_RESIST_ALL";
      }
      paVar6 = lookup_activation(pcVar9);
      art->activation = paVar6;
    }
    uVar2 = Rand_div(5);
    if (uVar2 != 0) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"acid resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if (uVar2 != 0) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"electricity resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if (uVar2 != 0) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"fire resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if (uVar2 == 0) break;
    goto LAB_001913a9;
  case L'\x0f':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(6);
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 9;
    if ((int)uVar2 < 0x14) {
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        paVar6 = lookup_activation("RAND_SLEEP_FOES");
        art->activation = paVar6;
      }
      uVar2 = Rand_div(4);
      pcVar9 = "stealth";
LAB_00191156:
      wVar8 = uVar2 + L'\x01';
LAB_0019115b:
      _Var11 = false;
LAB_0019115e:
      get_property(art,(object *)0x0,pcVar9,wVar8,_Var11);
    }
    else if ((int)uVar2 < 0x1e) {
      uVar2 = Rand_div(2);
      if (uVar2 == 0) {
        uVar2 = Rand_div(2);
        if (uVar2 == 0) {
          pcVar9 = "RAND_CONFU_FOES";
        }
        else {
          pcVar9 = "RAND_TURN_FOES";
        }
LAB_00192b70:
        paVar6 = lookup_activation(pcVar9);
        art->activation = paVar6;
      }
    }
    else if ((int)uVar2 < 0x28) {
      uVar2 = Rand_div(4);
      if ((uVar2 == 0) && (L'ஷ' < potential)) {
        paVar6 = lookup_activation("RAND_SHIELD");
        art->activation = paVar6;
      }
      uVar2 = Rand_div(3);
      get_property(art,(object *)0x0,"armor bonus",potential / 0x640 + uVar2 + L'\x01',true);
      uVar2 = Rand_div(3);
      get_property(art,(object *)0x0,"extra armor",potential / 0x640 + uVar2 + L'\x01',true);
      uVar2 = Rand_div(3);
      if (uVar2 == 0) {
        uVar2 = Rand_div(5);
        wVar8 = uVar2 + L'\x04';
        pcVar9 = "damage reduction";
        _Var11 = true;
        goto LAB_0019115e;
      }
    }
    else {
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(2);
        if (uVar2 == 0) {
          pcVar9 = "RAND_DETECT_MONSTERS";
        }
        else {
          pcVar9 = "RAND_DETECT_EVIL";
        }
        goto LAB_00192b70;
      }
      if ((int)uVar2 < 0x3c) {
        uVar2 = Rand_div(3);
        if (uVar2 != 0) {
          if ((potential < L'ྠ') || (uVar2 = Rand_div(3), uVar2 == 0)) {
            if (potential < L'ஸ') {
              pcVar9 = "RAND_DETECT_D_S_T";
            }
            else {
              pcVar9 = "RAND_MAGIC_MAP";
            }
          }
          else {
            pcVar9 = "RAND_DETECT_ALL";
          }
          paVar6 = lookup_activation(pcVar9);
          art->activation = paVar6;
        }
        uVar2 = Rand_div(4);
        pcVar9 = "searching skill";
        goto LAB_00191156;
      }
      if ((int)uVar2 < 0x41) {
        uVar2 = Rand_div(3);
        uVar3 = Rand_div(2);
        if (uVar3 == 0) {
          paVar6 = lookup_activation("RAND_SLOW_FOES");
          art->activation = paVar6;
        }
        if (uVar2 < 3) {
          iVar12 = *(int *)(&DAT_0022f0e8 + (ulong)uVar2 * 4);
          uVar2 = Rand_div(5);
          get_property(art,(object *)0x0,&DAT_0022f0e8 + iVar12,uVar2 * 5 + L'#',false);
        }
        uVar2 = Rand_div(4);
        get_property(art,(object *)0x0,"infravision",uVar2 + L'\x01',false);
        uVar2 = Rand_div(6);
        if (uVar2 == 0) {
          uVar2 = Rand_div(2);
          wVar8 = ~uVar2;
          pcVar9 = "magic mastery";
          goto LAB_0019115b;
        }
      }
    }
    wVar8 = art->sval;
    wVar4 = lookup_sval(L'\x0f',"Elven Cloak");
    if (wVar8 == wVar4) {
      lVar7 = (long)potential;
      uVar2 = Rand_div(2);
      art->modifiers[5] =
           (short)uVar2 +
           ((short)(uint)((ulong)(lVar7 * 0x68db8bad) >> 0x2a) - (short)(lVar7 * 0x68db8bad >> 0x3f)
           ) + art->modifiers[5] + 1;
    }
    break;
  case L'\x10':
  case L'\x11':
  case L'\x12':
    uVar2 = Rand_div(100);
    uVar3 = Rand_div(8);
    wVar8 = potential;
    art->to_a = ((short)(uint)((ulong)((long)potential * 0x57619f1) >> 0x25) -
                (short)((long)potential * 0x57619f1 >> 0x3f)) + (short)uVar3 + art->to_a + 0xb;
    if ((int)uVar2 < 0x1e) {
      uVar2 = Rand_div(2);
      if (L'ஷ' < potential && uVar2 == 0) {
        pcVar9 = "RAND_RESIST_ELEMENTS";
        if (L'ᕻ' < potential) {
          pcVar9 = "RAND_RESIST_ALL";
        }
        paVar6 = lookup_activation(pcVar9);
        art->activation = paVar6;
      }
      uVar2 = Rand_div(5);
      if (uVar2 != 0) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"acid resistance",uVar2 * 5 + L'#',true);
      }
      uVar2 = Rand_div(5);
      if (uVar2 != 0) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"electricity resistance",uVar2 * 5 + L'#',true);
      }
      uVar2 = Rand_div(5);
      if (uVar2 != 0) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"fire resistance",uVar2 * 5 + L'#',true);
      }
      uVar2 = Rand_div(5);
      if (uVar2 != 0) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"cold resistance",uVar2 * 5 + L'#',true);
      }
      uVar2 = Rand_div(2);
      if ((uVar2 != 0) || (potential < L'ߐ')) break;
      uVar2 = Rand_div(5);
      wVar8 = uVar2 * 5 + L'#';
      goto LAB_00190cf8;
    }
    if ((int)uVar2 < 0x28) {
      if (L'ᕻ' < wVar8) {
        uVar2 = Rand_div(3);
        if (uVar2 != 0) {
          uVar2 = Rand_div(2);
          pcVar9 = "RAND_REGAIN";
          if (uVar2 == 0) {
            pcVar9 = "RAND_HEAL3";
          }
          paVar6 = lookup_activation(pcVar9);
          art->activation = paVar6;
        }
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"nether resistance",uVar2 * 5 + L'#',false);
        get_property(art,(object *)0x0,"hold life",L'\0',false);
        uVar2 = Rand_div(2);
        if (uVar2 == 0) {
          uVar2 = Rand_div(5);
          wVar8 = uVar2 * 5 + L'#';
          pcVar9 = "chaos resistance";
          goto LAB_001912ec;
        }
      }
    }
    else {
      if ((int)uVar2 < 0x32) {
        uVar2 = Rand_div(5);
        get_property(art,(object *)0x0,"sound resistance",uVar2 * 5 + L'#',false);
        pcVar9 = "protection from confusion";
        wVar8 = L'\0';
LAB_001912ec:
        _Var11 = false;
      }
      else {
        if ((int)uVar2 < 0x3e) {
          uVar2 = Rand_div(3);
          if ((uVar2 == 0) && (L'ྟ' < potential)) {
            paVar6 = lookup_activation("RAND_SHIELD");
            art->activation = paVar6;
          }
          uVar2 = Rand_div(3);
          get_property(art,(object *)0x0,"armor bonus",potential / 0x640 + uVar2 + L'\x01',true);
          uVar2 = Rand_div(3);
          get_property(art,(object *)0x0,"extra armor",potential / 0x640 + uVar2 + L'\x01',true);
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            uVar2 = Rand_div(10);
            get_property(art,(object *)0x0,"damage reduction",uVar2 + L'\x06',true);
          }
          uVar2 = Rand_div(5);
          if ((int)uVar2 < 2) {
            uVar2 = Rand_div(5);
            get_property(art,(object *)0x0,"acid resistance",uVar2 * 5 + L'#',true);
          }
          uVar2 = Rand_div(5);
          if ((int)uVar2 < 2) {
            uVar2 = Rand_div(5);
            get_property(art,(object *)0x0,"electricity resistance",uVar2 * 5 + L'#',true);
          }
          uVar2 = Rand_div(5);
          if ((int)uVar2 < 2) {
            uVar2 = Rand_div(5);
            get_property(art,(object *)0x0,"fire resistance",uVar2 * 5 + L'#',true);
          }
          uVar2 = Rand_div(5);
          if ((int)uVar2 < 2) {
            uVar2 = Rand_div(5);
            get_property(art,(object *)0x0,"cold resistance",uVar2 * 5 + L'#',true);
          }
          uVar2 = Rand_div(6);
          if (uVar2 == 0) {
            wVar8 = lookup_curse("impair hitpoint recovery");
            uVar2 = Rand_div(0x14);
            append_artifact_curse(art,wVar8,uVar2 + L'(');
            potential = potential + L'd';
          }
          break;
        }
        if ((int)uVar2 < 0x4a) {
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            uVar2 = Rand_div(2);
            pcVar9 = "RAND_BLESS";
            if (uVar2 == 0) {
              pcVar9 = "RAND_TELEPORT1";
            }
            paVar6 = lookup_activation(pcVar9);
            art->activation = paVar6;
          }
          uVar2 = Rand_div(5);
          get_property(art,(object *)0x0,"dark resistance",uVar2 * 5 + L'#',true);
          uVar2 = Rand_div(4);
          get_property(art,(object *)0x0,"stealth",uVar2 + L'\x01',true);
          get_property(art,(object *)0x0,"see invisible",L'\0',true);
          uVar2 = Rand_div(5);
          if (1 < (int)uVar2) goto LAB_001912f4;
          uVar2 = Rand_div(5);
          wVar8 = uVar2 * 5 + L'#';
          pcVar9 = "nether resistance";
        }
        else if ((int)uVar2 < 0x52) {
          if (wVar8 < L'ৄ') goto LAB_001912f4;
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            paVar6 = lookup_activation("RAND_CURE");
            art->activation = paVar6;
          }
          uVar2 = Rand_div(5);
          wVar8 = uVar2 * 5 + L'#';
          pcVar9 = "poison resistance";
        }
        else {
          if (0x5e < (int)uVar2) {
            if (99 < (int)uVar2) break;
            if (L'ᕻ' < wVar8) {
              uVar2 = Rand_div(4);
              switch(uVar2) {
              case 0:
                uVar3 = Rand_div(3);
                if (uVar3 != 0) {
                  paVar6 = lookup_activation("RAND_FIRE3");
                  art->activation = paVar6;
                }
                get_property(art,(object *)0x0,"fire resistance",L'd',true);
                uVar3 = Rand_div(4);
                if (uVar3 == 0) {
                  wVar8 = lookup_curse("demon summon");
                  uVar3 = Rand_div(0x14);
                  append_artifact_curse(art,wVar8,uVar3 + L'(');
                  potential = potential + L'd';
                }
                if (uVar2 == 3) goto switchD_001928b4_caseD_3;
                if (uVar2 == 2) goto switchD_001928b4_caseD_2;
                if (uVar2 == 1) goto switchD_001928b4_caseD_1;
                break;
              case 1:
switchD_001928b4_caseD_1:
                uVar3 = Rand_div(3);
                if (uVar3 != 0) {
                  paVar6 = lookup_activation("RAND_COLD3");
                  art->activation = paVar6;
                }
                get_property(art,(object *)0x0,"cold resistance",L'd',true);
                uVar3 = Rand_div(4);
                if (uVar3 == 0) {
                  wVar8 = lookup_curse("undead summon");
                  uVar3 = Rand_div(0x14);
                  append_artifact_curse(art,wVar8,uVar3 + L'(');
                  potential = potential + L'd';
                }
                if (uVar2 == 3) goto switchD_001928b4_caseD_3;
                if (uVar2 == 2) goto switchD_001928b4_caseD_2;
                break;
              case 2:
switchD_001928b4_caseD_2:
                uVar3 = Rand_div(3);
                if (uVar3 != 0) {
                  paVar6 = lookup_activation("RAND_ACID3");
                  art->activation = paVar6;
                }
                get_property(art,(object *)0x0,"acid resistance",L'd',true);
                if (uVar2 == 3) goto switchD_001928b4_caseD_3;
                break;
              case 3:
switchD_001928b4_caseD_3:
                uVar2 = Rand_div(3);
                if (uVar2 != 0) {
                  paVar6 = lookup_activation("RAND_ELEC3");
                  art->activation = paVar6;
                }
                get_property(art,(object *)0x0,"electricity resistance",L'd',true);
              }
            }
            uVar2 = Rand_div(5);
            if ((int)uVar2 < 2) {
              uVar2 = Rand_div(5);
              get_property(art,(object *)0x0,"acid resistance",uVar2 * 5 + L'#',true);
            }
            uVar2 = Rand_div(5);
            if ((int)uVar2 < 2) {
              uVar2 = Rand_div(5);
              get_property(art,(object *)0x0,"electricity resistance",uVar2 * 5 + L'#',true);
            }
            uVar2 = Rand_div(5);
            if ((int)uVar2 < 2) {
              uVar2 = Rand_div(5);
              get_property(art,(object *)0x0,"fire resistance",uVar2 * 5 + L'#',true);
            }
            uVar2 = Rand_div(5);
            if ((int)uVar2 < 2) {
              uVar2 = Rand_div(5);
              get_property(art,(object *)0x0,"cold resistance",uVar2 * 5 + L'#',true);
            }
            if (art->tval != L'\x12') break;
            iVar12 = potential / 0x9c4;
            uVar2 = Rand_div(2);
            wVar8 = uVar2 + iVar12 + L'\x01';
            pcVar9 = "speed";
            goto LAB_00191706;
          }
          uVar2 = Rand_div(3);
          if (uVar2 != 0) {
            pcVar9 = "RAND_LIGHT2";
            if (potential < L'ᆔ') {
              pcVar9 = "RAND_LIGHT1";
            }
            paVar6 = lookup_activation(pcVar9);
            art->activation = paVar6;
          }
          get_property(art,(object *)0x0,"light",L'\x01',true);
          uVar2 = Rand_div(5);
          wVar8 = uVar2 * 5 + L'#';
          pcVar9 = "light resistance";
        }
        _Var11 = true;
      }
      get_property(art,(object *)0x0,pcVar9,wVar8,_Var11);
    }
LAB_001912f4:
    uVar2 = Rand_div(5);
    if ((int)uVar2 < 2) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"acid resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if ((int)uVar2 < 2) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"electricity resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if ((int)uVar2 < 2) {
      uVar2 = Rand_div(5);
      get_property(art,(object *)0x0,"fire resistance",uVar2 * 5 + L'#',true);
    }
    uVar2 = Rand_div(5);
    if (1 < (int)uVar2) break;
LAB_001913a9:
    uVar2 = Rand_div(5);
    wVar8 = uVar2 * 5 + L'#';
    pcVar9 = "cold resistance";
LAB_001913c5:
    _Var11 = true;
LAB_00191709:
    get_property(art,(object *)0x0,pcVar9,wVar8,_Var11);
  }
switchD_0019286c_default:
  uVar2 = Rand_div(6);
  if (uVar2 == 0) {
    wVar8 = art->weight;
    uVar2 = Rand_div(2);
    if ((uVar2 == 0) && (L'\x1d' < art->weight)) {
      uVar2 = Rand_div((uint)art->weight / 10);
      wVar4 = uVar2 * 5 + art->weight + L'\n';
      art->weight = wVar4;
      potential = (wVar4 - wVar8) * 10 + potential;
    }
    else if (L'1' < art->weight) {
      uVar2 = Rand_div((uint)art->weight / 10);
      wVar4 = uVar2 * -5 + art->weight + L'\xfffffff6';
      art->weight = wVar4;
      wVar8 = potential + (wVar8 - wVar4) * -10;
      potential = L'\0';
      if (L'\0' < wVar8) {
        potential = wVar8;
      }
    }
  }
  return;
}

Assistant:

static void choose_artifact_theme(struct artifact *art)
{
	struct object_kind *kind = lookup_kind(art->tval, art->sval);

	/* Possibly make very powerful artifacts cursed. */
	if ((potential > 6000) && (potential > randint1(30000))) {
		int max_tries;
		for (max_tries = 3; max_tries; max_tries--) {
			int pick = randint1(z_info->curse_max - 1);
			int power = randint1(9) + 10 * m_bonus(9, art->alloc_min);
			if (!curses[pick].poss[art->tval]) continue;
			append_artifact_curse(art, pick, power);
		}
	}

	/* Frequently (but not always) assign a basic theme to the artifact. */
	switch (kind->tval) {
		case TV_SWORD:
		case TV_POLEARM:
		case TV_HAFTED: choose_melee_weapon_theme(art); break;
		case TV_BOW: choose_launcher_theme(art); break;
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR: choose_armor_theme(art); break;
		case TV_SHIELD: choose_shield_theme(art); break;
		case TV_BOOTS: choose_boots_theme(art); break;
		case TV_CLOAK: choose_cloak_theme(art); break;
		case TV_HELM:
		case TV_CROWN: choose_hat_theme(art); break;
		case TV_GLOVES: choose_gloves_theme(art); break;
		default: msg("error -- object kind not recognized."); break;
	}

	/* It is possible for artifacts to be unusually heavy or light. */
	if (one_in_(6)) {
		int old_weight = art->weight;
		if (one_in_(2) && (art->weight >= 30)) {
			/* Sometimes, they are unusually heavy. */
			art->weight += randint1(art->weight / 10) * 5 + 5;
			potential += (art->weight - old_weight) * 10;
		} else if (art->weight >= 50) {
			/* Sometimes, they are unusually light. */
			art->weight -= randint1(art->weight / 10) * 5 + 5;
			potential -= (old_weight - art->weight) * 10;
			potential = MAX(potential, 0);
		}
	}
}